

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reactive_socket_recvfrom_op.hpp
# Opt level: O2

void __thiscall
asio::detail::
reactive_socket_recvfrom_op_base<asio::mutable_buffers_1,_asio::ip::basic_endpoint<asio::ip::udp>_>
::reactive_socket_recvfrom_op_base
          (reactive_socket_recvfrom_op_base<asio::mutable_buffers_1,_asio::ip::basic_endpoint<asio::ip::udp>_>
           *this,socket_type socket,int protocol_type,mutable_buffers_1 *buffers,
          basic_endpoint<asio::ip::udp> *endpoint,message_flags flags,func_type complete_func)

{
  size_t sVar1;
  
  reactor_op::reactor_op(&this->super_reactor_op,do_perform,complete_func);
  this->socket_ = socket;
  this->protocol_type_ = protocol_type;
  sVar1 = (buffers->super_mutable_buffer).size_;
  (this->buffers_).super_mutable_buffer.data_ = (buffers->super_mutable_buffer).data_;
  (this->buffers_).super_mutable_buffer.size_ = sVar1;
  this->sender_endpoint_ = endpoint;
  this->flags_ = flags;
  return;
}

Assistant:

reactive_socket_recvfrom_op_base(socket_type socket, int protocol_type,
      const MutableBufferSequence& buffers, Endpoint& endpoint,
      socket_base::message_flags flags, func_type complete_func)
    : reactor_op(&reactive_socket_recvfrom_op_base::do_perform, complete_func),
      socket_(socket),
      protocol_type_(protocol_type),
      buffers_(buffers),
      sender_endpoint_(endpoint),
      flags_(flags)
  {
  }